

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# repeated_field.h
# Opt level: O3

void google::protobuf::internal::PackedFieldHelper<7>::
     Serialize<google::protobuf::io::CodedOutputStream>
               (void *field,FieldMetadata *md,CodedOutputStream *output)

{
  uint uVar1;
  uint *puVar2;
  RepeatedField<unsigned_int> *array;
  int index;
  undefined4 local_30;
  uint32 local_2c;
  
  if (*field != 0) {
    local_2c = md->tag;
    PrimitiveTypeHelper<13>::Serialize(&local_2c,output);
    local_30 = *(undefined4 *)((long)field + 0x10);
    PrimitiveTypeHelper<13>::Serialize(&local_30,output);
    if (0 < *field) {
      index = 0;
      do {
        puVar2 = RepeatedField<unsigned_int>::Get((RepeatedField<unsigned_int> *)field,index);
        uVar1 = *puVar2;
        puVar2 = (uint *)output->cur_;
        if ((output->impl_).end_ <= puVar2) {
          puVar2 = (uint *)io::EpsCopyOutputStream::EnsureSpaceFallback
                                     (&output->impl_,(uint8 *)puVar2);
        }
        *puVar2 = uVar1;
        output->cur_ = (uint8 *)(puVar2 + 1);
        index = index + 1;
      } while (index < *field);
    }
  }
  return;
}

Assistant:

inline bool RepeatedField<Element>::empty() const {
  return current_size_ == 0;
}